

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidateDataStructure.cpp
# Opt level: O2

void __thiscall Assimp::ValidateDSProcess::Validate(ValidateDSProcess *this,aiMesh *pMesh)

{
  float fVar1;
  uint uVar2;
  bool bVar3;
  uint i_1;
  ulong uVar4;
  pointer __p;
  long lVar5;
  ulong uVar6;
  char *pcVar7;
  ValidateDSProcess *pVVar8;
  aiBone *this_00;
  aiBone *paVar9;
  aiFace *paVar10;
  uint i;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  reference rVar14;
  unique_ptr<float[],_std::default_delete<float[]>_> afSum;
  vector<bool,_std::allocator<bool>_> abRefList;
  
  paVar9 = (aiBone *)&afSum;
  uVar2 = this->mScene->mNumMaterials;
  if ((uVar2 == 0) || (uVar12 = (ulong)pMesh->mMaterialIndex, pMesh->mMaterialIndex < uVar2)) {
    pVVar8 = this;
    Validate(this,&pMesh->mName);
    uVar12 = (ulong)pMesh->mNumFaces;
    lVar5 = 8;
    for (uVar4 = 0; uVar12 != uVar4; uVar4 = uVar4 + 1) {
      pVVar8 = (ValidateDSProcess *)pMesh->mFaces;
      uVar2 = pMesh->mPrimitiveTypes;
      if (uVar2 != 0) {
        switch(*(undefined4 *)((long)pVVar8 + lVar5 + -8)) {
        case 0:
          pcVar7 = "aiMesh::mFaces[%i].mNumIndices is 0";
          goto LAB_0031df06;
        case 1:
          if ((uVar2 & 1) == 0) {
            pcVar7 = 
            "aiMesh::mFaces[%i] is a POINT but aiMesh::mPrimitiveTypes does not report the POINT flag"
            ;
            goto LAB_0031df06;
          }
          break;
        case 2:
          if ((uVar2 & 2) == 0) {
            pcVar7 = 
            "aiMesh::mFaces[%i] is a LINE but aiMesh::mPrimitiveTypes does not report the LINE flag"
            ;
            goto LAB_0031df06;
          }
          break;
        case 3:
          if ((uVar2 & 4) == 0) {
            pcVar7 = 
            "aiMesh::mFaces[%i] is a TRIANGLE but aiMesh::mPrimitiveTypes does not report the TRIANGLE flag"
            ;
            goto LAB_0031df06;
          }
          break;
        default:
          if ((uVar2 & 8) == 0) {
            pcVar7 = 
            "aiMesh::mFaces[%i] is a POLYGON but aiMesh::mPrimitiveTypes does not report the POLYGON flag"
            ;
            goto LAB_0031df06;
          }
        }
      }
      if (*(long *)((long)&(pVVar8->super_BaseProcess)._vptr_BaseProcess + lVar5) == 0) {
        pcVar7 = "aiMesh::mFaces[%i].mIndices is NULL";
LAB_0031df06:
        ReportError(pVVar8,pcVar7,uVar4 & 0xffffffff);
      }
      lVar5 = lVar5 + 0x10;
    }
    uVar2 = pMesh->mNumVertices;
    if (((ulong)uVar2 == 0) ||
       ((pMesh->mVertices == (aiVector3D *)0x0 && (this->mScene->mFlags == 0)))) {
      pcVar7 = "The mesh %s contains no vertices";
LAB_0031dfa4:
      ReportError(pVVar8,pcVar7,(pMesh->mName).data);
    }
    if ((int)uVar2 < 0) {
      pcVar7 = "Mesh has too many vertices: %u, but the limit is %u";
      uVar12 = (ulong)uVar2;
    }
    else {
      if (-1 < (int)pMesh->mNumFaces) {
        if ((pMesh->mBitangents == (aiVector3D *)0x0) == (pMesh->mTangents != (aiVector3D *)0x0)) {
          ReportError(pVVar8,"If there are tangents, bitangent vectors must be present as well");
        }
        if ((uVar12 != 0) && ((pMesh->mFaces != (aiFace *)0x0 || (this->mScene->mFlags != 0)))) {
          pVVar8 = (ValidateDSProcess *)&abRefList;
          abRefList.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
          abRefList.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_offset = 0;
          abRefList.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
          abRefList.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_offset = 0;
          abRefList.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_end_of_storage = (_Bit_pointer)0x0;
          uVar11 = 0;
          std::vector<bool,_std::allocator<bool>_>::resize
                    ((vector<bool,_std::allocator<bool>_> *)pVVar8,(ulong)uVar2,false);
          while( true ) {
            if (pMesh->mNumFaces <= uVar11) {
              bVar3 = false;
              for (uVar12 = 0; uVar12 < pMesh->mNumVertices; uVar12 = uVar12 + 1) {
                pVVar8 = (ValidateDSProcess *)&abRefList;
                rVar14 = std::vector<bool,_std::allocator<bool>_>::operator[](&abRefList,uVar12);
                bVar3 = (bool)(bVar3 | (*rVar14._M_p & rVar14._M_mask) == 0);
              }
              abRefList.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_finish.super__Bit_iterator_base._M_p =
                   abRefList.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
              abRefList.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_finish.super__Bit_iterator_base._M_offset = 0;
              if (bVar3) {
                ReportWarning(pVVar8,"There are unreferenced vertices");
              }
              lVar5 = 0;
              while (((lVar5 != 8 && (pMesh->mTextureCoords[lVar5] != (aiVector3D *)0x0)) &&
                     (pMesh->mNumVertices != 0))) {
                lVar5 = lVar5 + 1;
              }
              while( true ) {
                if (lVar5 == 8) {
                  lVar5 = 0;
                  while (((lVar5 != 8 && (pMesh->mColors[lVar5] != (aiColor4D *)0x0)) &&
                         (pMesh->mNumVertices != 0))) {
                    lVar5 = lVar5 + 1;
                  }
                  while( true ) {
                    if (lVar5 == 8) {
                      uVar2 = pMesh->mNumBones;
                      if (uVar2 == 0) {
                        if (pMesh->mBones != (aiBone **)0x0) {
                          ReportError(pVVar8,
                                      "aiMesh::mBones is non-null although there are no bones");
                        }
                      }
                      else {
                        if (pMesh->mBones == (aiBone **)0x0) {
                          ReportError(pVVar8,"aiMesh::mBones is NULL (aiMesh::mNumBones is %i)");
                        }
                        afSum._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                        super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                        super__Head_base<0UL,_float_*,_false>._M_head_impl =
                             (__uniq_ptr_data<float,_std::default_delete<float[]>,_true,_true>)
                             (__uniq_ptr_impl<float,_std::default_delete<float[]>_>)0x0;
                        this_00 = (aiBone *)(ulong)pMesh->mNumVertices;
                        if (this_00 != (aiBone *)0x0) {
                          __p = (pointer)operator_new__((long)this_00 << 2);
                          std::__uniq_ptr_impl<float,_std::default_delete<float[]>_>::reset
                                    ((__uniq_ptr_impl<float,_std::default_delete<float[]>_> *)&afSum
                                     ,__p);
                          for (uVar12 = 0; uVar12 < pMesh->mNumVertices; uVar12 = uVar12 + 1) {
                            *(undefined4 *)
                             ((long)afSum._M_t.
                                    super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t
                                    .super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                                    super__Head_base<0UL,_float_*,_false>._M_head_impl + uVar12 * 4)
                                 = 0;
                          }
                          uVar2 = pMesh->mNumBones;
                          this_00 = paVar9;
                        }
                        uVar6 = (ulong)uVar2;
                        uVar12 = 1;
                        uVar4 = 0;
                        while (uVar4 < uVar6) {
                          uVar2 = pMesh->mBones[uVar4]->mNumWeights;
                          if ((int)uVar2 < 0) {
                            ReportError((ValidateDSProcess *)this_00,
                                        "Bone %u has too many weights: %u, but the limit is %u",
                                        uVar4 & 0xffffffff,(ulong)uVar2,0x7fffffff);
                          }
                          Validate((ValidateDSProcess *)this_00,pMesh,pMesh->mBones[uVar4],
                                   (float *)afSum._M_t.
                                            super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>
                                            .super__Head_base<0UL,_float_*,_false>._M_head_impl);
                          for (uVar13 = uVar12; uVar6 = (ulong)pMesh->mNumBones, uVar13 < uVar6;
                              uVar13 = uVar13 + 1) {
                            this_00 = pMesh->mBones[uVar4];
                            bVar3 = aiString::operator==
                                              (&this_00->mName,&pMesh->mBones[uVar13]->mName);
                            if (bVar3) {
                              ReportError((ValidateDSProcess *)this_00,
                                          "aiMesh::mBones[%i], name = \"%s\" has the same name as aiMesh::mBones[%i]"
                                          ,uVar4 & 0xffffffff,(pMesh->mBones[uVar4]->mName).data,
                                          uVar13 & 0xffffffff);
                            }
                          }
                          uVar12 = (ulong)((int)uVar12 + 1);
                          uVar4 = uVar4 + 1;
                        }
                        for (uVar12 = 0; uVar12 < pMesh->mNumVertices; uVar12 = uVar12 + 1) {
                          fVar1 = *(float *)((long)afSum._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>
                                                  .super__Head_base<0UL,_float_*,_false>.
                                                  _M_head_impl + uVar12 * 4);
                          if (((fVar1 != 0.0) || (NAN(fVar1))) &&
                             ((fVar1 <= 0.94 || (1.05 <= fVar1)))) {
                            ReportWarning((ValidateDSProcess *)this_00,
                                          "aiMesh::mVertices[%i]: bone weight sum != 1.0 (sum is %f)"
                                          ,uVar12 & 0xffffffff);
                          }
                        }
                        std::unique_ptr<float[],_std::default_delete<float[]>_>::~unique_ptr(&afSum)
                        ;
                      }
                      std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                                (&abRefList.super__Bvector_base<std::allocator<bool>_>);
                      return;
                    }
                    if ((pMesh->mColors[lVar5] != (aiColor4D *)0x0) && (pMesh->mNumVertices != 0))
                    break;
                    lVar5 = lVar5 + 1;
                  }
                  ReportError(pVVar8,
                              "Vertex color channel %i is exists although the previous channel was NULL."
                             );
                }
                if ((pMesh->mTextureCoords[lVar5] != (aiVector3D *)0x0) &&
                   (pMesh->mNumVertices != 0)) break;
                lVar5 = lVar5 + 1;
              }
              ReportError(pVVar8,
                          "Texture coordinate channel %i exists although the previous channel was NULL."
                         );
            }
            uVar2 = pMesh->mFaces[uVar11].mNumIndices;
            uVar12 = (ulong)uVar2;
            if (0x7fff < uVar2) break;
            paVar10 = pMesh->mFaces + uVar11;
            for (uVar4 = 0; uVar4 < uVar12; uVar4 = uVar4 + 1) {
              uVar2 = paVar10->mIndices[uVar4];
              if (pMesh->mNumVertices <= uVar2) {
                ReportError(pVVar8,"aiMesh::mFaces[%i]::mIndices[%i] is out of range",(ulong)uVar11,
                            uVar4 & 0xffffffff);
              }
              pVVar8 = (ValidateDSProcess *)&abRefList;
              rVar14 = std::vector<bool,_std::allocator<bool>_>::operator[](&abRefList,(ulong)uVar2)
              ;
              *rVar14._M_p = *rVar14._M_p | rVar14._M_mask;
              uVar12 = (ulong)paVar10->mNumIndices;
            }
            uVar11 = uVar11 + 1;
          }
          ReportError(pVVar8,"Face %u has too many faces: %u, but the limit is %u",(ulong)uVar11,
                      uVar12,0x7fff);
        }
        pcVar7 = "Mesh %s contains no faces";
        goto LAB_0031dfa4;
      }
      pcVar7 = "Mesh has too many faces: %u, but the limit is %u";
    }
    uVar4 = 0x7fffffff;
    this = pVVar8;
  }
  else {
    uVar4 = (ulong)(uVar2 - 1);
    pcVar7 = "aiMesh::mMaterialIndex is invalid (value: %i maximum: %i)";
  }
  ReportError(this,pcVar7,uVar12,uVar4);
}

Assistant:

void ValidateDSProcess::Validate( const aiMesh* pMesh)
{
    // validate the material index of the mesh
    if (mScene->mNumMaterials && pMesh->mMaterialIndex >= mScene->mNumMaterials)
    {
        ReportError("aiMesh::mMaterialIndex is invalid (value: %i maximum: %i)",
            pMesh->mMaterialIndex,mScene->mNumMaterials-1);
    }

    Validate(&pMesh->mName);

    for (unsigned int i = 0; i < pMesh->mNumFaces; ++i)
    {
        aiFace& face = pMesh->mFaces[i];

        if (pMesh->mPrimitiveTypes)
        {
            switch (face.mNumIndices)
            {
            case 0:
                ReportError("aiMesh::mFaces[%i].mNumIndices is 0",i);
                break;
            case 1:
                if (0 == (pMesh->mPrimitiveTypes & aiPrimitiveType_POINT))
                {
                    ReportError("aiMesh::mFaces[%i] is a POINT but aiMesh::mPrimitiveTypes "
                        "does not report the POINT flag",i);
                }
                break;
            case 2:
                if (0 == (pMesh->mPrimitiveTypes & aiPrimitiveType_LINE))
                {
                    ReportError("aiMesh::mFaces[%i] is a LINE but aiMesh::mPrimitiveTypes "
                        "does not report the LINE flag",i);
                }
                break;
            case 3:
                if (0 == (pMesh->mPrimitiveTypes & aiPrimitiveType_TRIANGLE))
                {
                    ReportError("aiMesh::mFaces[%i] is a TRIANGLE but aiMesh::mPrimitiveTypes "
                        "does not report the TRIANGLE flag",i);
                }
                break;
            default:
                if (0 == (pMesh->mPrimitiveTypes & aiPrimitiveType_POLYGON))
                {
                    this->ReportError("aiMesh::mFaces[%i] is a POLYGON but aiMesh::mPrimitiveTypes "
                        "does not report the POLYGON flag",i);
                }
                break;
            };
        }

        if (!face.mIndices)
            ReportError("aiMesh::mFaces[%i].mIndices is NULL",i);
    }

    // positions must always be there ...
    if (!pMesh->mNumVertices || (!pMesh->mVertices && !mScene->mFlags)) {
        ReportError("The mesh %s contains no vertices", pMesh->mName.C_Str());
    }

    if (pMesh->mNumVertices > AI_MAX_VERTICES) {
        ReportError("Mesh has too many vertices: %u, but the limit is %u",pMesh->mNumVertices,AI_MAX_VERTICES);
    }
    if (pMesh->mNumFaces > AI_MAX_FACES) {
        ReportError("Mesh has too many faces: %u, but the limit is %u",pMesh->mNumFaces,AI_MAX_FACES);
    }

    // if tangents are there there must also be bitangent vectors ...
    if ((pMesh->mTangents != NULL) != (pMesh->mBitangents != NULL)) {
        ReportError("If there are tangents, bitangent vectors must be present as well");
    }

    // faces, too
    if (!pMesh->mNumFaces || (!pMesh->mFaces && !mScene->mFlags))   {
        ReportError("Mesh %s contains no faces", pMesh->mName.C_Str());
    }

    // now check whether the face indexing layout is correct:
    // unique vertices, pseudo-indexed.
    std::vector<bool> abRefList;
    abRefList.resize(pMesh->mNumVertices,false);
    for (unsigned int i = 0; i < pMesh->mNumFaces;++i)
    {
        aiFace& face = pMesh->mFaces[i];
        if (face.mNumIndices > AI_MAX_FACE_INDICES) {
            ReportError("Face %u has too many faces: %u, but the limit is %u",i,face.mNumIndices,AI_MAX_FACE_INDICES);
        }

        for (unsigned int a = 0; a < face.mNumIndices;++a)
        {
            if (face.mIndices[a] >= pMesh->mNumVertices)    {
                ReportError("aiMesh::mFaces[%i]::mIndices[%i] is out of range",i,a);
            }
            // the MSB flag is temporarily used by the extra verbose
            // mode to tell us that the JoinVerticesProcess might have
            // been executed already.
			/*if ( !(this->mScene->mFlags & AI_SCENE_FLAGS_NON_VERBOSE_FORMAT ) && !(this->mScene->mFlags & AI_SCENE_FLAGS_ALLOW_SHARED) &&
				abRefList[face.mIndices[a]])
            {
                ReportError("aiMesh::mVertices[%i] is referenced twice - second "
                    "time by aiMesh::mFaces[%i]::mIndices[%i]",face.mIndices[a],i,a);
            }*/
            abRefList[face.mIndices[a]] = true;
        }
    }

    // check whether there are vertices that aren't referenced by a face
    bool b = false;
    for (unsigned int i = 0; i < pMesh->mNumVertices;++i)   {
        if (!abRefList[i])b = true;
    }
    abRefList.clear();
    if (b) {
    	ReportWarning("There are unreferenced vertices");
    }

    // texture channel 2 may not be set if channel 1 is zero ...
    {
        unsigned int i = 0;
        for (;i < AI_MAX_NUMBER_OF_TEXTURECOORDS;++i)
        {
            if (!pMesh->HasTextureCoords(i))break;
        }
        for (;i < AI_MAX_NUMBER_OF_TEXTURECOORDS;++i)
            if (pMesh->HasTextureCoords(i))
            {
                ReportError("Texture coordinate channel %i exists "
                    "although the previous channel was NULL.",i);
            }
    }
    // the same for the vertex colors
    {
        unsigned int i = 0;
        for (;i < AI_MAX_NUMBER_OF_COLOR_SETS;++i)
        {
            if (!pMesh->HasVertexColors(i))break;
        }
        for (;i < AI_MAX_NUMBER_OF_COLOR_SETS;++i)
            if (pMesh->HasVertexColors(i))
            {
                ReportError("Vertex color channel %i is exists "
                    "although the previous channel was NULL.",i);
            }
    }


    // now validate all bones
    if (pMesh->mNumBones)
    {
        if (!pMesh->mBones)
        {
            ReportError("aiMesh::mBones is NULL (aiMesh::mNumBones is %i)",
                pMesh->mNumBones);
        }
        std::unique_ptr<float[]> afSum(nullptr);
        if (pMesh->mNumVertices)
        {
            afSum.reset(new float[pMesh->mNumVertices]);
            for (unsigned int i = 0; i < pMesh->mNumVertices;++i)
                afSum[i] = 0.0f;
        }

        // check whether there are duplicate bone names
        for (unsigned int i = 0; i < pMesh->mNumBones;++i)
        {
            const aiBone* bone = pMesh->mBones[i];
            if (bone->mNumWeights > AI_MAX_BONE_WEIGHTS) {
                ReportError("Bone %u has too many weights: %u, but the limit is %u",i,bone->mNumWeights,AI_MAX_BONE_WEIGHTS);
            }

            if (!pMesh->mBones[i])
            {
                ReportError("aiMesh::mBones[%i] is NULL (aiMesh::mNumBones is %i)",
                    i,pMesh->mNumBones);
            }
            Validate(pMesh,pMesh->mBones[i],afSum.get());

            for (unsigned int a = i+1; a < pMesh->mNumBones;++a)
            {
                if (pMesh->mBones[i]->mName == pMesh->mBones[a]->mName)
                {
                    const char *name = "unknown";
                    if (nullptr != pMesh->mBones[ i ]->mName.C_Str()) {
                        name = pMesh->mBones[ i ]->mName.C_Str();
                    }
                    ReportError("aiMesh::mBones[%i], name = \"%s\" has the same name as "
                        "aiMesh::mBones[%i]", i, name, a );
                }
            }
        }
        // check whether all bone weights for a vertex sum to 1.0 ...
        for (unsigned int i = 0; i < pMesh->mNumVertices;++i)
        {
            if (afSum[i] && (afSum[i] <= 0.94 || afSum[i] >= 1.05)) {
                ReportWarning("aiMesh::mVertices[%i]: bone weight sum != 1.0 (sum is %f)",i,afSum[i]);
            }
        }
    }
    else if (pMesh->mBones)
    {
        ReportError("aiMesh::mBones is non-null although there are no bones");
    }
}